

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O0

uint256 * __thiscall
CPartialMerkleTree::TraverseAndExtract
          (CPartialMerkleTree *this,int height,uint pos,uint *nBitsUsed,uint *nHashUsed,
          vector<uint256,_std::allocator<uint256>_> *vMatch,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vnIndex)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  reference pvVar6;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  uint256 *in_RDI;
  uint *in_R8;
  uint *in_R9;
  long in_FS_OFFSET;
  reference rVar7;
  vector<uint256,_std::allocator<uint256>_> *unaff_retaddr;
  uint256 *in_stack_00000008;
  base_blob<256U> *in_stack_00000010;
  uint256 *hash;
  bool fParentOfMatch;
  uint256 right;
  uint256 left;
  _Bit_reference *in_stack_ffffffffffffff08;
  uint256 *this_00;
  value_type *in_stack_ffffffffffffff10;
  base_blob<256U> *pbVar8;
  CPartialMerkleTree *in_stack_ffffffffffffff18;
  uint256 *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  int height_01;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar9;
  int height_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = *in_R8;
  sVar5 = std::vector<bool,_std::allocator<bool>_>::size
                    ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff18);
  if (uVar9 < sVar5) {
    *in_R8 = *in_R8 + 1;
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff18,
                       (size_type)in_stack_ffffffffffffff10);
    uVar9 = rVar7._M_mask._4_4_;
    height_01 = (int)((ulong)in_R8 >> 0x20);
    bVar2 = std::_Bit_reference::operator_cast_to_bool(in_stack_ffffffffffffff08);
    if ((in_EDX == 0) || (!(bool)bVar2)) {
      uVar9 = *in_R9;
      sVar5 = std::vector<uint256,_std::allocator<uint256>_>::size
                        ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff08);
      if (uVar9 < sVar5) {
        *in_R9 = *in_R9 + 1;
        pvVar6 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                           ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff18,
                            (size_type)in_stack_ffffffffffffff10);
        if ((in_EDX == 0) && ((bVar2 & 1) != 0)) {
          std::vector<uint256,_std::allocator<uint256>_>::push_back
                    ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff18,(value_type_conflict2 *)in_stack_ffffffffffffff10);
        }
        *(undefined8 *)(in_RDI->super_base_blob<256U>).m_data._M_elems =
             *(undefined8 *)(pvVar6->super_base_blob<256U>).m_data._M_elems;
        *(undefined8 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 8) =
             *(undefined8 *)((pvVar6->super_base_blob<256U>).m_data._M_elems + 8);
        *(undefined8 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 0x10) =
             *(undefined8 *)((pvVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
        *(undefined8 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 0x18) =
             *(undefined8 *)((pvVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
      }
      else {
        *(undefined1 *)(in_RSI + 0x48) = 1;
        memset(in_RDI,0,0x20);
        uint256::uint256((uint256 *)in_stack_ffffffffffffff08);
      }
    }
    else {
      this_00 = in_stack_00000008;
      pbVar8 = in_stack_00000010;
      TraverseAndExtract((CPartialMerkleTree *)CONCAT44(in_EDX,in_stack_ffffffffffffff70),height_01,
                         uVar9,in_R9,(uint *)CONCAT17(bVar2,in_stack_ffffffffffffff58),unaff_retaddr
                         ,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_00000008);
      height_00 = (int)((ulong)pbVar8 >> 0x20);
      uint256::uint256(this_00);
      uVar4 = CalcTreeWidth(in_stack_ffffffffffffff18,height_00);
      if (in_ECX * 2 + 1U < uVar4) {
        TraverseAndExtract((CPartialMerkleTree *)CONCAT44(in_EDX,in_stack_ffffffffffffff70),
                           height_01,uVar9,in_R9,(uint *)CONCAT17(bVar2,in_stack_ffffffffffffff58),
                           unaff_retaddr,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_00000008)
        ;
        bVar3 = ::operator==((base_blob<256U> *)in_stack_ffffffffffffff18,in_stack_00000010);
        if (bVar3) {
          *(undefined1 *)(in_RSI + 0x48) = 1;
        }
      }
      Hash<uint256,uint256>
                ((uint256 *)CONCAT17(bVar2,in_stack_ffffffffffffff58),in_stack_ffffffffffffff50);
    }
  }
  else {
    *(undefined1 *)(in_RSI + 0x48) = 1;
    memset(in_RDI,0,0x20);
    uint256::uint256((uint256 *)in_stack_ffffffffffffff08);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

uint256 CPartialMerkleTree::TraverseAndExtract(int height, unsigned int pos, unsigned int &nBitsUsed, unsigned int &nHashUsed, std::vector<uint256> &vMatch, std::vector<unsigned int> &vnIndex) {
    if (nBitsUsed >= vBits.size()) {
        // overflowed the bits array - failure
        fBad = true;
        return uint256();
    }
    bool fParentOfMatch = vBits[nBitsUsed++];
    if (height==0 || !fParentOfMatch) {
        // if at height 0, or nothing interesting below, use stored hash and do not descend
        if (nHashUsed >= vHash.size()) {
            // overflowed the hash array - failure
            fBad = true;
            return uint256();
        }
        const uint256 &hash = vHash[nHashUsed++];
        if (height==0 && fParentOfMatch) { // in case of height 0, we have a matched txid
            vMatch.push_back(hash);
            vnIndex.push_back(pos);
        }
        return hash;
    } else {
        // otherwise, descend into the subtrees to extract matched txids and hashes
        uint256 left = TraverseAndExtract(height-1, pos*2, nBitsUsed, nHashUsed, vMatch, vnIndex), right;
        if (pos*2+1 < CalcTreeWidth(height-1)) {
            right = TraverseAndExtract(height-1, pos*2+1, nBitsUsed, nHashUsed, vMatch, vnIndex);
            if (right == left) {
                // The left and right branches should never be identical, as the transaction
                // hashes covered by them must each be unique.
                fBad = true;
            }
        } else {
            right = left;
        }
        // and combine them before returning
        return Hash(left, right);
    }
}